

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmutex.cpp
# Opt level: O2

CK_RV OSDestroyMutex(CK_VOID_PTR mutex)

{
  uint uVar1;
  CK_RV CStack_10;
  
  if (mutex == (CK_VOID_PTR)0x0) {
    softHSMLog(3,"OSDestroyMutex",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
               ,0x50,"Cannot destroy NULL mutex");
    CStack_10 = 7;
  }
  else {
    uVar1 = pthread_mutex_destroy((pthread_mutex_t *)mutex);
    if (uVar1 == 0) {
      free(mutex);
      CStack_10 = 0;
    }
    else {
      softHSMLog(3,"OSDestroyMutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
                 ,0x57,"Failed to destroy POSIX mutex (0x%08X)",(ulong)uVar1);
      CStack_10 = 5;
    }
  }
  return CStack_10;
}

Assistant:

CK_RV OSDestroyMutex(CK_VOID_PTR mutex)
{
	int rv;
	pthread_mutex_t* pthreadMutex = (pthread_mutex_t*) mutex;

	if (pthreadMutex == NULL)
	{
		ERROR_MSG("Cannot destroy NULL mutex");

		return CKR_ARGUMENTS_BAD;
	}

	if ((rv = pthread_mutex_destroy(pthreadMutex)) != 0)
	{
		ERROR_MSG("Failed to destroy POSIX mutex (0x%08X)", rv);

		return CKR_GENERAL_ERROR;
	}

	free(pthreadMutex);

	return CKR_OK;
}